

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metro_exodus.cpp
# Opt level: O0

void __thiscall
App<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::run
          (App<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  bool bVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  uint local_104;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_bd;
  bool res;
  undefined1 local_b0 [8];
  string des;
  string src;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  prev;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
  dist;
  App<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_local;
  
  display_welcome(this);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
         *)&prev._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)((long)&src.field_2 + 8));
  std::__cxx11::string::string((string *)(des.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_b0);
  get_input(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (des.field_2._M_local_buf + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  std::__cxx11::string::string((string *)&local_e0,(string *)(des.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_100,(string *)local_b0);
  bVar1 = uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          print_adj(&this->metro,&local_e0,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_e0);
  local_bd = bVar1;
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_128,(string *)(des.field_2._M_local_buf + 8));
    uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    dijkstra_sssp(&this->metro,&local_128,
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                   *)&prev._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)((long)&src.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_128);
    poVar2 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    std::operator<<(poVar2,"\t\t");
    poVar2 = std::operator<<((ostream *)&std::cout,"Distance from ");
    poVar2 = std::operator<<(poVar2,(string *)(des.field_2._M_local_buf + 8));
    poVar2 = std::operator<<(poVar2," to ");
    poVar2 = std::operator<<(poVar2,(string *)local_b0);
    poVar2 = std::operator<<(poVar2," - ");
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                           *)&prev._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          (key_type *)local_b0);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pmVar3);
    poVar2 = std::operator<<(poVar2," Kms");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"\t\tPath: ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::string((string *)&local_148,(string *)local_b0);
    uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    dijkstra_get_sssp(&this->metro,&local_148,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)((long)&src.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_148);
    uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    make_dot_file(&this->metro);
    std::__cxx11::string::string((string *)&local_168,(string *)(des.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&local_188,(string *)local_b0);
    uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    calc_price(&this->metro,&local_168,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_168);
    display_output(this);
  }
  else {
    handle_error(this);
  }
  local_104 = (uint)!bVar1;
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)(des.field_2._M_local_buf + 8));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)((long)&src.field_2 + 8));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
          *)&prev._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void run() {
      display_welcome();
      map<ver, float> dist;
      map<ver, ver> prev;
      string src, des;
      get_input(src, des);

      bool res = metro.print_adj(src, des);
      if (!res) {//error handling
        handle_error();
        return;
      }
      metro.dijkstra_sssp(src, dist, prev);
      cout << endl << "\t\t";
      cout << "Distance from " << src << " to " << des << " - " << dist[des] << " Kms" << endl;
      cout << endl << "\t\tPath: " << endl;
      metro.dijkstra_get_sssp(des, prev);
      metro.make_dot_file();
      metro.calc_price(src, des);
      display_output();
    }